

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O0

void __thiscall Fl_Menu_Bar_Type::ideal_size(Fl_Menu_Bar_Type *this,int *w,int *h)

{
  int iVar1;
  Fl_Fontsize FVar2;
  Fl_Boxtype t;
  Fl_Window *this_00;
  int *h_local;
  int *w_local;
  Fl_Menu_Bar_Type *this_local;
  
  this_00 = Fl_Widget::window((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  iVar1 = Fl_Widget::w((Fl_Widget *)this_00);
  *w = iVar1;
  FVar2 = Fl_Widget::labelsize((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  t = Fl_Widget::box((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  iVar1 = Fl::box_dh(t);
  *h = ((FVar2 + iVar1 + 4) / 5) * 5;
  if (*h < 0xf) {
    *h = 0xf;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    w = o->window()->w();
    h = ((o->labelsize() + Fl::box_dh(o->box()) + 4) / 5) * 5;
    if (h < 15) h = 15;
  }